

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = execution_is_branchless(this,from,to);
  if (bVar1) {
    while (bVar1 = (from->super_IVariant).self.id == (to->super_IVariant).self.id, !bVar1) {
      bVar2 = block_is_noop(this,from);
      if (!bVar2) {
        return bVar1;
      }
      from = get<spirv_cross::SPIRBlock>(this,(from->next_block).id);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!block_is_noop(*start))
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		start = &next;
	}
}